

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

Symbol * __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::createPort
          (NonAnsiPortListBuilder *this,string_view name,SourceLocation externalLoc,
          PortConcatenationSyntax *syntax)

{
  int *piVar1;
  Scope *pSVar2;
  Compilation *this_00;
  bool bVar3;
  int iVar4;
  PortReferenceSyntax *syntax_00;
  SourceLocation externalLoc_00;
  Symbol *pSVar5;
  Diagnostic *this_01;
  undefined4 extraout_var;
  MultiPortSymbol *pMVar6;
  EVP_PKEY_CTX *pEVar7;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  basic_string_view<char,_std::char_traits<char>_> *args;
  ulong uVar8;
  ulong uVar9;
  SourceRange SVar10;
  int local_f8;
  uint local_f0;
  ArgumentDirection dir;
  ulong local_e8;
  bool hadError;
  const_iterator __begin3;
  Token local_c8;
  PortConcatenationSyntax *local_b8;
  ulong local_b0;
  ParentList *local_a8;
  anon_class_24_3_f8a52b29 reportDirError;
  SourceLocation externalLoc_local;
  string_view name_local;
  SmallVector<const_slang::ast::PortSymbol_*,_5UL> buffer;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  dir = In;
  buffer.super_SmallVectorBase<const_slang::ast::PortSymbol_*>.data_ =
       (pointer)buffer.super_SmallVectorBase<const_slang::ast::PortSymbol_*>.firstElement;
  buffer.super_SmallVectorBase<const_slang::ast::PortSymbol_*>.len = 0;
  buffer.super_SmallVectorBase<const_slang::ast::PortSymbol_*>.cap = 5;
  reportDirError.hadError = &hadError;
  hadError = false;
  __begin3.list = &syntax->references;
  __begin3.index = 0;
  local_b0 = (syntax->references).elements._M_extent._M_extent_value + 1 >> 1;
  bVar3 = true;
  local_e8 = 0;
  uVar8 = 0;
  uVar9 = 0;
  local_f8 = 0;
  pEVar7 = (EVP_PKEY_CTX *)CONCAT71(name._M_str._1_7_,1);
  local_f0 = (uint)pEVar7;
  local_b8 = syntax;
  local_a8 = __begin3.list;
  reportDirError.this = this;
  reportDirError.syntax = syntax;
  externalLoc_local = externalLoc;
  do {
    if ((__begin3.list == local_a8) && (__begin3.index == local_b0)) {
      this_00 = this->comp;
      iVar4 = SmallVectorBase<const_slang::ast::PortSymbol_*>::copy
                        (&buffer.super_SmallVectorBase<const_slang::ast::PortSymbol_*>,
                         (EVP_PKEY_CTX *)this_00,pEVar7);
      __begin3.list = (ParentList *)CONCAT44(extraout_var,iVar4);
      args = &name_local;
      pMVar6 = BumpAllocator::
               emplace<slang::ast::MultiPortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::PortSymbol_const*,18446744073709551615ul>,slang::ast::ArgumentDirection&>
                         (&this_00->super_BumpAllocator,args,&externalLoc_local,
                          (span<const_slang::ast::PortSymbol_*,_18446744073709551615UL> *)&__begin3,
                          &dir);
      (pMVar6->super_Symbol).originatingSyntax = (SyntaxNode *)local_b8;
      SmallVectorBase<const_slang::ast::PortSymbol_*>::cleanup
                (&buffer.super_SmallVectorBase<const_slang::ast::PortSymbol_*>,(EVP_PKEY_CTX *)args)
      ;
      return &pMVar6->super_Symbol;
    }
    syntax_00 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::
                iterator_base<const_slang::syntax::PortReferenceSyntax_*>::dereference(&__begin3);
    local_c8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax_00);
    externalLoc_00 = parsing::Token::location(&local_c8);
    pSVar5 = createPort(this,(string_view)(ZEXT816(0x4b214a) << 0x40),externalLoc_00,syntax_00);
    if (pSVar5->kind == Port) {
      piVar1 = *(int **)(pSVar5 + 1);
      pEVar7 = extraout_RDX;
      if (piVar1 != (int *)0x0) {
        local_c8._0_8_ = pSVar5;
        SmallVectorBase<slang::ast::PortSymbol_const*>::emplace_back<slang::ast::PortSymbol_const*>
                  ((SmallVectorBase<slang::ast::PortSymbol_const*> *)&buffer,
                   (PortSymbol **)&local_c8);
        pSVar5->parentScope = this->scope;
        iVar4 = *(int *)&pSVar5[1].name._M_str;
        pEVar7 = extraout_RDX_00;
        if (iVar4 == 3) {
          dir = Ref;
          uVar9 = 3;
          local_e8 = 3;
          uVar8 = 3;
          if (!bVar3) {
            createPort::anon_class_24_3_f8a52b29::operator()(&reportDirError,(DiagCode)0x9c0006);
            uVar9 = 3;
            local_e8 = 3;
            uVar8 = 3;
            pEVar7 = extraout_RDX_03;
          }
        }
        else if (iVar4 == 2) {
          dir = InOut;
          uVar9 = 2;
          local_e8 = 2;
          uVar8 = 2;
          if ((local_f0 & 1) == 0) {
            createPort::anon_class_24_3_f8a52b29::operator()(&reportDirError,(DiagCode)0x9b0006);
            uVar9 = 2;
            local_e8 = 2;
            uVar8 = 2;
            pEVar7 = extraout_RDX_01;
          }
        }
        else if ((iVar4 == 1) && (local_f8 == 0)) {
          dir = Out;
          uVar9 = 1;
          local_e8 = 1;
          uVar8 = 1;
        }
        if (*piVar1 == 0x3b) {
          local_f8 = (int)uVar8;
          if (local_f8 == 3) {
            createPort::anon_class_24_3_f8a52b29::operator()(&reportDirError,(DiagCode)0x9c0006);
            pEVar7 = extraout_RDX_04;
          }
          if (*(int *)(*(long *)(piVar1 + 0x54) + 0x80) == 0xd) {
            pSVar2 = this->scope;
            SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
            Scope::addDiag(pSVar2,(DiagCode)0x510006,SVar10);
            pEVar7 = extraout_RDX_07;
          }
          else if (*(int *)(*(long *)(piVar1 + 0x54) + 0x80) == 0xc) {
            local_f8 = (int)local_e8;
            if (local_f8 == 2) {
              createPort::anon_class_24_3_f8a52b29::operator()(&reportDirError,(DiagCode)0x9b0006);
              local_f8 = 2;
              local_e8 = 2;
              pEVar7 = extraout_RDX_05;
            }
            bVar3 = false;
            uVar8 = local_e8 & 0xffffffff;
            local_f0 = 0;
            uVar9 = local_e8 & 0xffffffff;
            goto LAB_003315d6;
          }
          bVar3 = false;
          uVar9 = uVar8;
        }
        else {
          local_f8 = (int)uVar9;
          if (local_f8 == 2) {
            createPort::anon_class_24_3_f8a52b29::operator()(&reportDirError,(DiagCode)0x9b0006);
            local_f0 = 0;
            uVar9 = 2;
            local_f8 = 2;
            pEVar7 = extraout_RDX_06;
          }
          else {
            local_f0 = 0;
          }
        }
      }
    }
    else {
      pSVar2 = this->scope;
      SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
      this_01 = Scope::addDiag(pSVar2,(DiagCode)0x450006,SVar10);
      Diagnostic::operator<<(this_01,pSVar5->name);
      pEVar7 = extraout_RDX_02;
    }
LAB_003315d6:
    __begin3.index = __begin3.index + 1;
  } while( true );
}

Assistant:

Symbol& createPort(std::string_view name, SourceLocation externalLoc,
                       const PortConcatenationSyntax& syntax) {
        ArgumentDirection dir = ArgumentDirection::In;
        SmallVector<const PortSymbol*> buffer;
        bool allNets = true;
        bool allVars = true;
        bool hadError = false;

        auto reportDirError = [&](DiagCode code) {
            if (!hadError) {
                scope.addDiag(code, syntax.sourceRange());
                hadError = true;
            }
        };

        for (auto item : syntax.references) {
            auto& port = createPort(""sv, item->getFirstToken().location(), *item);
            if (port.kind == SymbolKind::Port) {
                auto& ps = port.as<PortSymbol>();
                auto sym = ps.internalSymbol;
                if (!sym)
                    continue;

                buffer.push_back(&ps);
                ps.setParent(scope);

                // We need to merge the port direction with all of the other component port
                // directions to come up with our "effective" direction, which is what we use
                // to create connection expressions. The rules here are not spelled out in the
                // LRM, but here's what I think makes sense based on other language rules:
                // - If all the directions are the same, that's the effective direction.
                // - inputs and outputs can be freely mixed; output direction dominates.
                // - if any port is ref, all ports must be variables. Effective direction is ref.
                // - if any port is inout, all ports must be nets. Effective direction is inout.
                // - ref and inout can never mix (implied by above two points).
                if (ps.direction == ArgumentDirection::InOut) {
                    dir = ArgumentDirection::InOut;
                    if (!allNets)
                        reportDirError(diag::PortConcatInOut);
                }
                else if (ps.direction == ArgumentDirection::Ref) {
                    dir = ArgumentDirection::Ref;
                    if (!allVars)
                        reportDirError(diag::PortConcatRef);
                }
                else if (ps.direction == ArgumentDirection::Out && dir == ArgumentDirection::In) {
                    dir = ArgumentDirection::Out;
                }

                if (sym->kind == SymbolKind::Net) {
                    allVars = false;
                    if (dir == ArgumentDirection::Ref)
                        reportDirError(diag::PortConcatRef);

                    auto& net = sym->as<NetSymbol>();
                    if (net.netType.netKind == NetType::UWire) {
                        // UWire nets aren't resolvable nets and so act like variables
                        // for the purposes of these checks.
                        allNets = false;
                        if (dir == ArgumentDirection::InOut)
                            reportDirError(diag::PortConcatInOut);
                    }
                    else if (net.netType.netKind == NetType::Interconnect) {
                        // Can't use interconnects in a port concat.
                        scope.addDiag(diag::InterconnectMultiPort, item->sourceRange());
                    }
                }
                else {
                    allNets = false;
                    if (dir == ArgumentDirection::InOut)
                        reportDirError(diag::PortConcatInOut);
                }
            }
            else {
                auto& diag = scope.addDiag(diag::IfacePortInExpr, item->sourceRange());
                diag << port.name;
            }
        }

        auto result = comp.emplace<MultiPortSymbol>(name, externalLoc, buffer.copy(comp), dir);
        result->setSyntax(syntax);
        return *result;
    }